

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_zip.c
# Opt level: O2

int archive_write_zip_finish_entry(archive_write *a)

{
  zip_conflict *zip;
  int64_t iVar1;
  uint64_t u;
  int iVar2;
  uchar *__dest;
  long lVar3;
  uchar uVar4;
  undefined4 uVar5;
  uchar *p;
  size_t length;
  uchar *puVar6;
  size_t sStack_60;
  uchar zip64 [32];
  
  zip = (zip_conflict *)a->format_data;
  if (zip->entry_compression == COMPRESSION_DEFLATE) {
    while( true ) {
      iVar2 = cm_zlib_deflate((z_streamp_conflict)&zip->stream,4);
      if (iVar2 == -2) {
        return -0x1e;
      }
      length = zip->len_buf - (ulong)(zip->stream).avail_out;
      iVar2 = __archive_write_output(a,zip->buf,length);
      if (iVar2 != 0) {
        return iVar2;
      }
      zip->entry_compressed_written = zip->entry_compressed_written + length;
      zip->written_bytes = zip->written_bytes + length;
      (zip->stream).next_out = zip->buf;
      if ((zip->stream).avail_out != 0) break;
      (zip->stream).avail_out = (uInt)zip->len_buf;
    }
    cm_zlib_deflateEnd((z_streamp_conflict)&zip->stream);
  }
  if ((zip->entry_flags & 8) != 0) {
    builtin_memcpy(zip64,"PK\a\b",4);
    iVar1 = zip->entry_compressed_written;
    uVar5 = (undefined4)iVar1;
    zip64[8] = (char)uVar5;
    zip64[9] = (char)((uint)uVar5 >> 8);
    zip64[10] = (char)((uint)uVar5 >> 0x10);
    zip64[0xb] = (char)((uint)uVar5 >> 0x18);
    zip64._4_4_ = zip->entry_crc32;
    if (zip->entry_uses_zip64 == 0) {
      puVar6 = zip64 + 0xf;
      iVar1 = zip->entry_uncompressed_written;
      zip64[0xc] = (uchar)iVar1;
      zip64[0xd] = (uchar)((ulong)iVar1 >> 8);
      zip64[0xe] = (uchar)((ulong)iVar1 >> 0x10);
      uVar4 = (uchar)((ulong)iVar1 >> 0x18);
      sStack_60 = 0x10;
    }
    else {
      puVar6 = zip64 + 0x17;
      zip64[0xc] = (uchar)((ulong)iVar1 >> 0x20);
      zip64[0xd] = (uchar)((ulong)iVar1 >> 0x28);
      zip64[0xe] = (uchar)((ulong)iVar1 >> 0x30);
      zip64[0xf] = (uchar)((ulong)iVar1 >> 0x38);
      iVar1 = zip->entry_uncompressed_written;
      zip64[0x10] = (uchar)iVar1;
      zip64[0x11] = (uchar)((ulong)iVar1 >> 8);
      zip64[0x12] = (uchar)((ulong)iVar1 >> 0x10);
      zip64[0x13] = (uchar)((ulong)iVar1 >> 0x18);
      zip64[0x14] = (uchar)((ulong)iVar1 >> 0x20);
      zip64[0x15] = (uchar)((ulong)iVar1 >> 0x28);
      zip64[0x16] = (uchar)((ulong)iVar1 >> 0x30);
      uVar4 = (uchar)((ulong)iVar1 >> 0x38);
      sStack_60 = 0x18;
    }
    *puVar6 = uVar4;
    iVar2 = __archive_write_output(a,zip64,sStack_60);
    zip->written_bytes = zip->written_bytes + sStack_60;
    if (iVar2 != 0) {
      return -0x1e;
    }
  }
  u = zip->entry_compressed_written;
  lVar3 = zip->entry_uncompressed_written;
  if ((long)u < 0x100000000) {
    if (lVar3 < 0x100000000) {
      if (zip->entry_offset < 0x100000000) goto LAB_003fb3de;
      goto LAB_003fb317;
    }
LAB_003fb350:
    puVar6 = zip64 + 0xc;
    zip64._4_8_ = lVar3;
  }
  else {
LAB_003fb317:
    puVar6 = zip64 + 4;
    if (0xfffffffe < lVar3) goto LAB_003fb350;
  }
  zip64[0] = '\x01';
  zip64[1] = '\0';
  zip64[2] = '\0';
  zip64[3] = '\0';
  if (0xfffffffe < (long)u) {
    archive_le64enc(puVar6,u);
    puVar6 = puVar6 + 8;
  }
  if (0xfffffffe < zip->entry_offset) {
    archive_le64enc(puVar6,zip->entry_offset);
    puVar6 = puVar6 + 8;
  }
  zip64._2_2_ = (short)puVar6 - ((short)zip64 + 4);
  __dest = cd_alloc(zip,(long)puVar6 - (long)zip64);
  if (__dest == (uchar *)0x0) {
    archive_set_error(&a->archive,0xc,"Can\'t allocate zip data");
    return -0x1e;
  }
  memcpy(__dest,zip64,(long)puVar6 - (long)zip64);
  puVar6 = zip->file_header;
  if (*(ushort *)(puVar6 + 6) < 0x2d) {
    puVar6[6] = '-';
    puVar6[7] = '\0';
  }
LAB_003fb3de:
  *(uint32_t *)(zip->file_header + 0x10) = zip->entry_crc32;
  lVar3 = zip->entry_compressed_written;
  if (0xfffffffe < lVar3) {
    lVar3 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x14) = (int)lVar3;
  lVar3 = zip->entry_uncompressed_written;
  if (0xfffffffe < lVar3) {
    lVar3 = 0xffffffff;
  }
  *(int *)(zip->file_header + 0x18) = (int)lVar3;
  *(short *)(zip->file_header + 0x1e) =
       (short)(int)zip->central_directory_bytes - (short)(int)zip->file_header_extra_offset;
  lVar3 = 0xffffffff;
  if (zip->entry_offset < 0xffffffff) {
    lVar3 = zip->entry_offset;
  }
  *(int *)(zip->file_header + 0x2a) = (int)lVar3;
  return 0;
}

Assistant:

static int
archive_write_zip_finish_entry(struct archive_write *a)
{
	struct zip *zip = a->format_data;
	int ret;

#if HAVE_ZLIB_H
	if (zip->entry_compression == COMPRESSION_DEFLATE) {
		for (;;) {
			size_t remainder;
			ret = deflate(&zip->stream, Z_FINISH);
			if (ret == Z_STREAM_ERROR)
				return (ARCHIVE_FATAL);
			remainder = zip->len_buf - zip->stream.avail_out;
			ret = __archive_write_output(a, zip->buf, remainder);
			if (ret != ARCHIVE_OK)
				return (ret);
			zip->entry_compressed_written += remainder;
			zip->written_bytes += remainder;
			zip->stream.next_out = zip->buf;
			if (zip->stream.avail_out != 0)
				break;
			zip->stream.avail_out = (uInt)zip->len_buf;
		}
		deflateEnd(&zip->stream);
	}
#endif

	/* Write trailing data descriptor. */
	if ((zip->entry_flags & ZIP_ENTRY_FLAG_LENGTH_AT_END) != 0) {
		char d[24];
		memcpy(d, "PK\007\010", 4);
		archive_le32enc(d + 4, zip->entry_crc32);
		if (zip->entry_uses_zip64) {
			archive_le64enc(d + 8, (uint64_t)zip->entry_compressed_written);
			archive_le64enc(d + 16, (uint64_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 24);
			zip->written_bytes += 24;
		} else {
			archive_le32enc(d + 8, (uint32_t)zip->entry_compressed_written);
			archive_le32enc(d + 12, (uint32_t)zip->entry_uncompressed_written);
			ret = __archive_write_output(a, d, 16);
			zip->written_bytes += 16;
		}
		if (ret != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Append Zip64 extra data to central directory information. */
	if (zip->entry_compressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_uncompressed_written > ARCHIVE_LITERAL_LL(0xffffffff)
	    || zip->entry_offset > ARCHIVE_LITERAL_LL(0xffffffff)) {
		unsigned char zip64[32];
		unsigned char *z = zip64, *zd;
		memcpy(z, "\001\000\000\000", 4);
		z += 4;
		if (zip->entry_uncompressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_uncompressed_written);
			z += 8;
		}
		if (zip->entry_compressed_written >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_compressed_written);
			z += 8;
		}
		if (zip->entry_offset >= ARCHIVE_LITERAL_LL(0xffffffff)) {
			archive_le64enc(z, zip->entry_offset);
			z += 8;
		}
		archive_le16enc(zip64 + 2, z - (zip64 + 4));
		zd = cd_alloc(zip, z - zip64);
		if (zd == NULL) {
			archive_set_error(&a->archive, ENOMEM,
				"Can't allocate zip data");
			return (ARCHIVE_FATAL);
		}
		memcpy(zd, zip64, z - zip64);
		/* Zip64 means version needs to be set to at least 4.5 */
		if (archive_le16dec(zip->file_header + 6) < 45)
			archive_le16enc(zip->file_header + 6, 45);
	}

	/* Fix up central directory file header. */
	archive_le32enc(zip->file_header + 16, zip->entry_crc32);
	archive_le32enc(zip->file_header + 20,
	    zipmin(zip->entry_compressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le32enc(zip->file_header + 24,
	    zipmin(zip->entry_uncompressed_written, ARCHIVE_LITERAL_LL(0xffffffff)));
	archive_le16enc(zip->file_header + 30,
	    zip->central_directory_bytes - zip->file_header_extra_offset);
	archive_le32enc(zip->file_header + 42,
	    zipmin(zip->entry_offset, ARCHIVE_LITERAL_LL(0xffffffff)));

	return (ARCHIVE_OK);
}